

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhash.cpp
# Opt level: O0

void uhash_removeAll_63(UHashtable *hash)

{
  UHashElement *e_00;
  UHashElement *e;
  UHashtable *pUStack_10;
  int32_t pos;
  UHashtable *hash_local;
  
  e._4_4_ = 0xffffffff;
  pUStack_10 = hash;
  if (hash->count != 0) {
    while (e_00 = uhash_nextElement_63(pUStack_10,(int32_t *)((long)&e + 4)),
          e_00 != (UHashElement *)0x0) {
      uhash_removeElement_63(pUStack_10,e_00);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uhash_removeAll(UHashtable *hash) {
    int32_t pos = UHASH_FIRST;
    const UHashElement *e;
    U_ASSERT(hash != NULL);
    if (hash->count != 0) {
        while ((e = uhash_nextElement(hash, &pos)) != NULL) {
            uhash_removeElement(hash, e);
        }
    }
    U_ASSERT(hash->count == 0);
}